

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

int __thiscall jrtplib::RTPTCPTransmitter::AbortWait(RTPTCPTransmitter *this)

{
  RTPTCPTransmitter *this_local;
  
  if ((this->m_init & 1U) == 0) {
    this_local._4_4_ = -0xb5;
  }
  else if ((this->m_created & 1U) == 0) {
    this_local._4_4_ = -0xbb;
  }
  else if ((this->m_waitingForData & 1U) == 0) {
    this_local._4_4_ = -0xc1;
  }
  else {
    RTPAbortDescriptors::SendAbortSignal(this->m_pAbortDesc);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPTCPTransmitter::AbortWait()
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}
	if (!m_waitingForData)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTWAITING;
	}

	m_pAbortDesc->SendAbortSignal();
	
	MAINMUTEX_UNLOCK
	return 0;
}